

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

int __thiscall QLocale::toInt(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  QSimpleParsedNumber<long_long> QVar5;
  
  pQVar1 = (this->d).d.ptr;
  QVar5 = QLocaleData::stringToLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  iVar2 = (int)QVar5.result;
  if (ok == (bool *)0x0) {
    bVar4 = (long)iVar2 == QVar5.result;
  }
  else {
    bVar4 = (long)iVar2 == QVar5.result;
    *ok = 0 < QVar5.used && bVar4;
  }
  iVar3 = 0;
  if (bVar4) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

int QLocale::toInt(QStringView s, bool *ok) const
{
    return toIntegral_helper<int>(d, s, ok);
}